

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O1

void __thiscall
PrintTuple<CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type>
::print_formatted(PrintTuple<CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type>
                  *this,Printer *p,char *s)

{
  char *s_00;
  PrintNumber local_3c;
  PrintTuple<PrintNumber> local_38;
  char *local_28;
  
  do {
    if (*s == '%') {
      s_00 = s + 1;
      if (s[1] != '%') {
        local_3c.n = (uint)this->t0->index;
        local_38.t0 = &local_3c;
        local_28 = "t%";
        PrintTuple<PrintNumber>::print_formatted(&local_38,p,"t%");
        PrintTuple<CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type,_CodegenC::Type>
        ::print_formatted(&this->t,p,s_00);
        return;
      }
    }
    else {
      s_00 = s;
      if (*s == '\0') {
        return;
      }
    }
    std::ostream::put((char)p->ostream);
    s = s_00 + 1;
  } while( true );
}

Assistant:

void print_formatted(const Printer& p, const char* s) const {
		while (*s) {
			if (*s == '%') {
				++s;
				if (*s != '%') {
					p.print(t0);
					t.print_formatted(p, s);
					return;
				}
			}
			p.print(*s);
			++s;
		}
	}